

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O2

HalfEdge * __thiscall MeshLib::Vertex::most_ccw_in_halfedge(Vertex *this)

{
  HalfEdge *this_00;
  
  if (this->m_boundary == true) {
    this_00 = this->m_halfedge;
    while( true ) {
      this_00 = HalfEdge::ccw_rotate_about_target(this_00);
      if (this_00 == (HalfEdge *)0x0) break;
      this->m_halfedge = this_00;
    }
  }
  return this->m_halfedge;
}

Assistant:

HalfEdge *  Vertex::most_ccw_in_halfedge()  
{ 
	if( !m_boundary )
	{
		return m_halfedge; //current half edge is the most ccw in halfedge 
	}

	HalfEdge * he = m_halfedge->ccw_rotate_about_target();
	
	while( he != NULL )
	{
		m_halfedge = he;
		he = m_halfedge->ccw_rotate_about_target();
	}

	return m_halfedge;
}